

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall
CVmObjClass::load_image_data(CVmObjClass *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  int iVar1;
  vm_intcls_ext *pvVar2;
  unsigned_long uVar3;
  ulong in_RCX;
  long in_RDX;
  CVmObjClass *in_RDI;
  vm_intcls_ext *ext;
  undefined4 in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  CVmObjClass *in_stack_ffffffffffffffd8;
  
  if (in_RCX < 8) {
    err_throw(0);
  }
  pvVar2 = alloc_ext(in_stack_ffffffffffffffd8);
  iVar1 = ::osrp2((void *)(in_RDX + 2));
  pvVar2->meta_idx = iVar1;
  uVar3 = ::osrp4((void *)(in_RDX + 4));
  pvVar2->mod_obj = (vm_obj_id_t)uVar3;
  vm_val_t::set_nil(&pvVar2->class_state);
  if (10 < in_RCX) {
    vmb_get_dh((char *)in_RDI,
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  register_meta(in_RDI,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void CVmObjClass::load_image_data(VMG_ vm_obj_id_t self,
                                  const char *ptr, size_t siz)
{
    /* make sure the length is valid */
    if (siz < 8)
        err_throw(VMERR_INVAL_METACLASS_DATA);

    /* allocate or reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = osrp2(ptr+2);
    ext->mod_obj = (vm_obj_id_t)t3rp4u(ptr+4);

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (siz >= 2+4+VMB_DATAHOLDER)
        vmb_get_dh(ptr+8, &ext->class_state);
        
    /* register myself */
    register_meta(vmg_ self);
}